

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_setup_connection(Curl_easy *data,connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  data_local._4_4_ = imap_init(data);
  if (data_local._4_4_ == CURLE_OK) {
    *(ulong *)&(conn->bits).field_0x4 = *(ulong *)&(conn->bits).field_0x4 & 0xfffffffeffffffff;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  /* Initialise the IMAP layer */
  CURLcode result = imap_init(data);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->bits.tls_upgraded = FALSE;

  return CURLE_OK;
}